

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O1

int http_RequestAndResponse
              (uri_type *destination,char *request,size_t request_length,http_method_t req_method,
              int timeout_secs,http_parser_t *response)

{
  int iVar1;
  socklen_t addrlen;
  sockaddr_storage *serv_addr;
  int http_error_code;
  SOCKINFO info;
  int local_c0;
  int local_bc;
  SOCKINFO local_b8;
  
  local_c0 = timeout_secs;
  iVar1 = socket((uint)(destination->hostport).IPaddress.ss_family,1,0);
  if (iVar1 == -1) {
    parser_response_init(response,req_method);
    iVar1 = -0xd0;
  }
  else {
    iVar1 = sock_init(&local_b8,iVar1);
    if (iVar1 == 0) {
      serv_addr = &(destination->hostport).IPaddress;
      addrlen = 0x10;
      if (serv_addr->ss_family == 10) {
        addrlen = 0x1c;
      }
      iVar1 = private_connect(local_b8.socket,(sockaddr *)serv_addr,addrlen);
      if (iVar1 == -1) {
        parser_response_init(response,req_method);
        iVar1 = -0xcc;
      }
      else {
        iVar1 = http_SendMessage(&local_b8,&local_c0,"b",request,request_length);
        if (iVar1 == 0) {
          iVar1 = http_RecvMessage(&local_b8,response,req_method,&local_c0,&local_bc);
        }
        else {
          parser_response_init(response,req_method);
        }
      }
    }
    else {
      parser_response_init(response,req_method);
      iVar1 = -0xd0;
    }
    sock_destroy(&local_b8,2);
  }
  return iVar1;
}

Assistant:

int http_RequestAndResponse(uri_type *destination,
	const char *request,
	size_t request_length,
	http_method_t req_method,
	int timeout_secs,
	http_parser_t *response)
{
	SOCKET tcp_connection;
	int ret_code;
	size_t sockaddr_len;
	int http_error_code;
	SOCKINFO info;

	tcp_connection = socket(
		(int)destination->hostport.IPaddress.ss_family, SOCK_STREAM, 0);
	if (tcp_connection == INVALID_SOCKET) {
		parser_response_init(response, req_method);
		return UPNP_E_SOCKET_ERROR;
	}
	if (sock_init(&info, tcp_connection) != UPNP_E_SUCCESS) {
		parser_response_init(response, req_method);
		ret_code = UPNP_E_SOCKET_ERROR;
		goto end_function;
	}
	/* connect */
	sockaddr_len = destination->hostport.IPaddress.ss_family == AF_INET6
			       ? sizeof(struct sockaddr_in6)
			       : sizeof(struct sockaddr_in);
	ret_code = private_connect(info.socket,
		(struct sockaddr *)&(destination->hostport.IPaddress),
		(socklen_t)sockaddr_len);
	if (ret_code == -1) {
		parser_response_init(response, req_method);
		ret_code = UPNP_E_SOCKET_CONNECT;
		goto end_function;
	}
	/* send request */
	ret_code = http_SendMessage(
		&info, &timeout_secs, "b", request, request_length);
	if (ret_code != 0) {
		parser_response_init(response, req_method);
		goto end_function;
	}
	/* recv response */
	ret_code = http_RecvMessage(
		&info, response, req_method, &timeout_secs, &http_error_code);

end_function:
	/* should shutdown completely */
	sock_destroy(&info, SD_BOTH);

	return ret_code;
}